

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

void light_pcapng_close(light_pcapng_t *pcapng)

{
  void *in_RDI;
  light_pcapng unaff_retaddr;
  void *x_ret;
  
  if (in_RDI == (void *)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_pcapng_close",0x207);
  }
  else {
    light_pcapng_release(unaff_retaddr);
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      light_flush((__fd_t)0x1077d2);
      light_close((__fd_t)0x1077e0);
    }
    light_free_file_info((light_pcapng_file_info *)0x1077ee);
    free(in_RDI);
  }
  return;
}

Assistant:

void light_pcapng_close(light_pcapng_t *pcapng)
{
	DCHECK_NULLP(pcapng, return);
	light_pcapng_release(pcapng->pcapng);
	if (pcapng->file != NULL)
	{
		light_flush(pcapng->file);
		light_close(pcapng->file);
	}
	light_free_file_info(pcapng->file_info);
	free(pcapng);
}